

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O0

void Sym_ManStop(Sym_Man_t *p)

{
  int local_14;
  int i;
  Sym_Man_t *p_local;
  
  Sym_ManPrintStats(p);
  if (p->vSuppFun != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSuppFun);
  }
  if (p->vSim != (Vec_Ptr_t *)0x0) {
    Sim_UtilInfoFree(p->vSim);
  }
  if (p->vNodes != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vNodes);
  }
  if (p->vSupports != (Vec_Vec_t *)0x0) {
    Vec_VecFree(p->vSupports);
  }
  for (local_14 = 0; local_14 < p->nOutputs; local_14 = local_14 + 1) {
    Extra_BitMatrixStop((Extra_BitMat_t *)p->vMatrSymms->pArray[local_14]);
    Extra_BitMatrixStop((Extra_BitMat_t *)p->vMatrNonSymms->pArray[local_14]);
  }
  Vec_IntFree(p->vVarsU);
  Vec_IntFree(p->vVarsV);
  Vec_PtrFree(p->vMatrSymms);
  Vec_PtrFree(p->vMatrNonSymms);
  Vec_IntFree(p->vPairsTotal);
  Vec_IntFree(p->vPairsSym);
  Vec_IntFree(p->vPairsNonSym);
  if (p->uPatRand != (uint *)0x0) {
    free(p->uPatRand);
    p->uPatRand = (uint *)0x0;
  }
  if (p->uPatCol != (uint *)0x0) {
    free(p->uPatCol);
    p->uPatCol = (uint *)0x0;
  }
  if (p->uPatRow != (uint *)0x0) {
    free(p->uPatRow);
    p->uPatRow = (uint *)0x0;
  }
  if (p != (Sym_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Sym_ManStop( Sym_Man_t * p )
{
    int i;
    Sym_ManPrintStats( p );
    if ( p->vSuppFun )     Sim_UtilInfoFree( p->vSuppFun );   
    if ( p->vSim )         Sim_UtilInfoFree( p->vSim );   
    if ( p->vNodes )       Vec_PtrFree( p->vNodes );
    if ( p->vSupports )    Vec_VecFree( p->vSupports );
    for ( i = 0; i < p->nOutputs; i++ )
    {
        Extra_BitMatrixStop( (Extra_BitMat_t *)p->vMatrSymms->pArray[i] );
        Extra_BitMatrixStop( (Extra_BitMat_t *)p->vMatrNonSymms->pArray[i] );
    }
    Vec_IntFree( p->vVarsU );
    Vec_IntFree( p->vVarsV );
    Vec_PtrFree( p->vMatrSymms );
    Vec_PtrFree( p->vMatrNonSymms );
    Vec_IntFree( p->vPairsTotal );
    Vec_IntFree( p->vPairsSym );
    Vec_IntFree( p->vPairsNonSym );
    ABC_FREE( p->uPatRand );
    ABC_FREE( p->uPatCol );
    ABC_FREE( p->uPatRow );
    ABC_FREE( p );
}